

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseXMLDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  Bool BVar2;
  Node *pNVar3;
  uint code;
  TidyDocImpl *element;
  Node *node;
  Node *pNVar4;
  
  prvTidySetOptionBool(doc,TidyXmlTags,yes);
  doc->xmlDetected = yes;
  pNVar3 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar3 != (Node *)0x0) {
    pNVar4 = (Node *)0x0;
LAB_0014151f:
    do {
      node = pNVar3;
      if (node->type == EndTag) {
        code = 0x287;
        element = (TidyDocImpl *)0x0;
LAB_00141533:
        prvTidyReport(doc,&element->root,node,code);
        prvTidyFreeNode(doc,node);
      }
      else {
        BVar2 = InsertMisc(&doc->root,node);
        if (BVar2 == no) {
          NVar1 = node->type;
          if (NVar1 == StartTag) {
            node->parent = &doc->root;
            if (doc == (TidyDocImpl *)0x0) {
              node->prev = (Node *)0x0;
LAB_001415fa:
              if (doc != (TidyDocImpl *)0x0) {
                (doc->root).content = node;
LAB_00141603:
                (doc->root).last = node;
              }
            }
            else {
              pNVar3 = (doc->root).last;
              node->prev = pNVar3;
              if (pNVar3 == (Node *)0x0) goto LAB_001415fa;
              pNVar3->next = node;
              if (doc != (TidyDocImpl *)0x0) goto LAB_00141603;
            }
            ParseHTMLWithNode(doc,node);
          }
          else {
            if (NVar1 != StartEndTag) {
              if (NVar1 != DocTypeTag) {
                code = 0x235;
                element = doc;
                goto LAB_00141533;
              }
              if (pNVar4 == (Node *)0x0) {
                node->parent = &doc->root;
                if (doc == (TidyDocImpl *)0x0) {
                  node->prev = (Node *)0x0;
LAB_00141669:
                  if (doc == (TidyDocImpl *)0x0) goto LAB_00141676;
                  (doc->root).content = node;
                }
                else {
                  pNVar3 = (doc->root).last;
                  node->prev = pNVar3;
                  if (pNVar3 == (Node *)0x0) goto LAB_00141669;
                  pNVar3->next = node;
                  if (doc == (TidyDocImpl *)0x0) goto LAB_00141676;
                }
                (doc->root).last = node;
              }
              else {
                prvTidyReport(doc,&doc->root,node,0x235);
                prvTidyFreeNode(doc,node);
                node = pNVar4;
              }
LAB_00141676:
              pNVar3 = prvTidyGetToken(doc,IgnoreWhitespace);
              pNVar4 = node;
              if (pNVar3 == (Node *)0x0) break;
              goto LAB_0014151f;
            }
            node->parent = &doc->root;
            if (doc == (TidyDocImpl *)0x0) {
              node->prev = (Node *)0x0;
LAB_001415dc:
              if (doc == (TidyDocImpl *)0x0) goto LAB_00141556;
              (doc->root).content = node;
            }
            else {
              pNVar3 = (doc->root).last;
              node->prev = pNVar3;
              if (pNVar3 == (Node *)0x0) goto LAB_001415dc;
              pNVar3->next = node;
              if (doc == (TidyDocImpl *)0x0) goto LAB_00141556;
            }
            (doc->root).last = node;
          }
        }
      }
LAB_00141556:
      pNVar3 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar3 != (Node *)0x0);
  }
  if (*(int *)((doc->config).value + 99) == 0) {
    return;
  }
  prvTidyFixXmlDecl(doc);
  return;
}

Assistant:

void TY_(ParseXMLDocument)(TidyDocImpl* doc)
{
    Node *node, *doctype = NULL;

    TY_(SetOptionBool)( doc, TidyXmlTags, yes );

    doc->xmlDetected = yes;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            TY_(Report)(doc, NULL, node, UNEXPECTED_ENDTAG);
            TY_(FreeNode)( doc, node);
            continue;
        }

         /* deal with comments etc. */
        if (InsertMisc( &doc->root, node))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == StartEndTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node);
            continue;
        }

       /* if start tag then parse element's content */
        if (node->type == StartTag)
        {
            TY_(InsertNodeAtEnd)( &doc->root, node );
            ParseHTMLWithNode( doc, node );
            continue;
        }

        TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    /* ensure presence of initial <?xml version="1.0"?> */
    if ( cfgBool(doc, TidyXmlDecl) )
        TY_(FixXmlDecl)( doc );
}